

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem.cpp
# Opt level: O0

double __thiscall Problem::getStateCost(Problem *this,vector<int,_std::allocator<int>_> *bidNos)

{
  reference pvVar1;
  reference pvVar2;
  double curcost;
  int curBidNumber;
  int i;
  double totalCost;
  vector<int,_std::allocator<int>_> *bidNos_local;
  Problem *this_local;
  
  _curBidNumber = 0.0;
  for (curcost._4_4_ = 0; curcost._4_4_ < this->numCompanies; curcost._4_4_ = curcost._4_4_ + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](bidNos,(long)curcost._4_4_);
    pvVar2 = std::vector<node,_std::allocator<node>_>::operator[]
                       (this->problemData + curcost._4_4_,(long)*pvVar1);
    _curBidNumber = pvVar2->price + _curBidNumber;
  }
  return _curBidNumber;
}

Assistant:

double Problem::getStateCost(vector<int> bidNos) {
    double totalCost = 0;
    for (int i = 0; i < this->numCompanies; i++) {
        int curBidNumber = bidNos[i];
        double curcost = this->problemData[i][curBidNumber].price;
        totalCost += curcost;
    }
    return (totalCost);// - 1000000*getStateConflicts(bidNos));
}